

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_members.cpp
# Opt level: O3

MemberSyntax * __thiscall
slang::parsing::Parser::parseMember(Parser *this,SyntaxKind parentKind,bool *anyLocalModules)

{
  SyntaxFactory *this_00;
  BumpAllocator *alloc;
  bool bVar1;
  TokenKind endKind;
  SyntaxKind SVar2;
  int iVar3;
  HierarchyInstantiationSyntax *pHVar4;
  PortDeclarationSyntax *pPVar5;
  MemberSyntax *pMVar6;
  DPIExportSyntax *pDVar7;
  StatementSyntax *statement;
  ProceduralBlockSyntax *pPVar8;
  UdpDeclarationSyntax *pUVar9;
  CheckerInstantiationSyntax *pCVar10;
  SequenceDeclarationSyntax *pSVar11;
  ImmediateAssertionMemberSyntax *pIVar12;
  TimeUnitsDeclarationSyntax *pTVar13;
  PropertyDeclarationSyntax *pPVar14;
  DPIImportSyntax *pDVar15;
  IfGenerateSyntax *pIVar16;
  GenvarDeclarationSyntax *pGVar17;
  GenerateRegionSyntax *pGVar18;
  LoopGenerateSyntax *pLVar19;
  ConfigDeclarationSyntax *pCVar20;
  BindDirectiveSyntax *pBVar21;
  CaseGenerateSyntax *pCVar22;
  CheckerDeclarationSyntax *pCVar23;
  ContinuousAssignSyntax *pCVar24;
  DefParamSyntax *pDVar25;
  NetAliasSyntax *pNVar26;
  CovergroupDeclarationSyntax *pCVar27;
  ModportDeclarationSyntax *pMVar28;
  ClassDeclarationSyntax *pCVar29;
  DataDeclarationSyntax *data;
  CheckerDataDeclarationSyntax *pCVar30;
  SpecifyBlockSyntax *pSVar31;
  ConcurrentAssertionStatementSyntax *pCVar32;
  ConcurrentAssertionMemberSyntax *pCVar33;
  SpecparamDeclarationSyntax *pSVar34;
  ElabSystemTaskSyntax *pEVar35;
  PrimitiveInstantiationSyntax *pPVar36;
  FunctionDeclarationSyntax *pFVar37;
  NamedLabelSyntax *label;
  SourceLocation SVar38;
  EmptyMemberSyntax *pEVar39;
  PackageImportDeclarationSyntax *pPVar40;
  Diagnostic *this_01;
  undefined4 extraout_var;
  uint uVar41;
  __extent_storage<18446744073709551615UL> _Var42;
  EVP_PKEY_CTX *extraout_RDX;
  EVP_PKEY_CTX *extraout_RDX_00;
  EVP_PKEY_CTX *extraout_RDX_01;
  EVP_PKEY_CTX *extraout_RDX_02;
  EVP_PKEY_CTX *src;
  __extent_storage<18446744073709551615UL> extraout_RDX_03;
  TokenKind TVar43;
  anon_class_8_1_8991fb9c *in_R8;
  uint32_t offset;
  AttrList attributes;
  Token TVar44;
  SourceRange SVar45;
  Token name;
  Token colon;
  Token TVar46;
  string_view arg;
  span<slang::parsing::Token,_18446744073709551615UL> qualifiers;
  Token token;
  Token endgenerate;
  SmallVector<slang::parsing::Token,_4UL> quals;
  SyntaxFactory *local_f8;
  Token local_f0;
  Token local_e0;
  undefined1 local_d0 [16];
  SyntaxNode *local_c0;
  SyntaxNode *pSStack_b8;
  Info *local_b0;
  AttrList local_a8;
  TokenList local_78;
  Token local_40;
  
  attributes = parseAttributes(this);
  _Var42 = attributes._M_extent._M_extent_value;
  bVar1 = isHierarchyInstantiation(this,false);
  if (bVar1) {
    pHVar4 = parseHierarchyInstantiation(this,attributes);
    return &pHVar4->super_MemberSyntax;
  }
  bVar1 = isPortDeclaration(this,false);
  if (bVar1) {
    pPVar5 = parsePortDeclaration(this,attributes);
    return &pPVar5->super_MemberSyntax;
  }
  bVar1 = isNetDeclaration(this);
  if (bVar1) {
    pMVar6 = parseNetDeclaration(this,attributes);
    return pMVar6;
  }
  bVar1 = isVariableDeclaration(this);
  if (bVar1) {
LAB_002d8b07:
    pMVar6 = parseVariableDeclaration(this,attributes);
    return pMVar6;
  }
  local_f0 = ParserBase::peek(&this->super_ParserBase);
  uVar41 = local_f0._0_4_ & 0xffff;
  TVar43 = local_f0.kind;
  if (0xa4 < uVar41) {
    if (uVar41 < 0xe8) {
      if (uVar41 < 0xc0) {
        SVar2 = 0x537ac0;
        switch(uVar41) {
        case 0xa5:
          TVar44 = ParserBase::peek(&this->super_ParserBase,1);
          if (TVar44.kind == StringLiteral) {
            pDVar7 = parseDPIExport(this,attributes);
            return &pDVar7->super_MemberSyntax;
          }
          pMVar6 = parseExportDeclaration(this,attributes);
          return pMVar6;
        case 0xa7:
          errorIfAttributes(this,attributes);
          pEVar35 = (ElabSystemTaskSyntax *)parseExternMember(this,parentKind,attributes);
          goto LAB_002d9503;
        case 0xa8:
          goto switchD_002d8b78_caseD_a8;
        case 0xaa:
          pLVar19 = parseLoopGenerateConstruct(this,attributes);
          return &pLVar19->super_MemberSyntax;
        case 0xb0:
          SVar2 = FunctionDeclaration;
          TVar43 = EndFunctionKeyword;
LAB_002d9139:
          pFVar37 = parseFunctionDeclaration
                              (this,attributes,SVar2,TVar43,parentKind,
                               (bitmask<slang::parsing::detail::FunctionOptions>)0x0);
          return &pFVar37->super_MemberSyntax;
        case 0xb1:
          errorIfAttributes(this,attributes);
          TVar44 = ParserBase::consume(&this->super_ParserBase);
          Token::Token(&local_e0);
          local_d0._0_8_ = this;
          local_78.super_span<slang::parsing::Token,_18446744073709551615UL> =
               (span<slang::parsing::Token,_18446744073709551615UL>)
               parseMemberList<slang::syntax::MemberSyntax,slang::parsing::Parser::parseMember(slang::syntax::SyntaxKind,bool&)::__0>
                         (this,(TokenKind)&local_e0,(Token *)local_d0,SVar2,in_R8);
          local_78.super_SyntaxListBase.childCount =
               (size_t)local_78.super_span<slang::parsing::Token,_18446744073709551615UL>._M_extent.
                       _M_extent_value;
          local_d0._8_4_ = SyntaxList;
          local_c0 = (SyntaxNode *)0x0;
          pSStack_b8 = (SyntaxNode *)0x0;
          local_d0._0_8_ = &PTR_getChild_006d0388;
          local_78.super_SyntaxListBase.super_SyntaxNode.kind = 1;
          local_78.super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)0x0;
          local_78.super_SyntaxListBase.super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
          local_78.super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_006d0478;
          local_b0 = (Info *)_Var42._M_extent_value;
          local_a8 = attributes;
          pGVar18 = slang::syntax::SyntaxFactory::generateRegion
                              (&this->factory,
                               (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)local_d0,TVar44
                               ,(SyntaxList<slang::syntax::MemberSyntax> *)&local_78,local_e0);
          return &pGVar18->super_MemberSyntax;
        case 0xb2:
          pGVar17 = parseGenvarDeclaration(this,attributes);
          return &pGVar17->super_MemberSyntax;
        case 0xb3:
          goto switchD_002d8b78_caseD_b3;
        case 0xb6:
          pIVar16 = parseIfGenerateConstruct(this,attributes);
          return &pIVar16->super_MemberSyntax;
        case 0xbd:
          TVar44 = ParserBase::peek(&this->super_ParserBase,1);
          if (TVar44.kind == StringLiteral) {
            pDVar15 = parseDPIImport(this,attributes);
            return &pDVar15->super_MemberSyntax;
          }
          pPVar40 = parseImportDeclaration(this,attributes);
          return &pPVar40->super_MemberSyntax;
        }
      }
      else if (uVar41 < 0xd5) {
        if (uVar41 == 0xc0) {
          TVar46 = ParserBase::consume(&this->super_ParserBase);
          SVar2 = slang::syntax::SyntaxFacts::getProceduralBlockKind(TVar46.kind);
          bVar1 = true;
          goto LAB_002d8c2c;
        }
        if (uVar41 == 200) {
          TVar44 = ParserBase::peek(&this->super_ParserBase,1);
          if (TVar44.kind == ClassKeyword) goto LAB_002d93bd;
          goto switchD_002d8c81_caseD_e8;
        }
      }
      else {
        if (uVar41 == 0xd5) {
switchD_002d8c81_caseD_e8:
          pMVar6 = parseModule(this,attributes,parentKind,anyLocalModules);
          return pMVar6;
        }
        if (uVar41 == 0xd8) {
          pMVar28 = parseModportDeclaration(this,attributes);
          return &pMVar28->super_MemberSyntax;
        }
        if (uVar41 == 0xd9) goto switchD_002d8c81_caseD_e8;
      }
    }
    else if (uVar41 < 0x11a) {
      if (uVar41 < 0xf9) {
        switch(uVar41) {
        case 0xe8:
        case 0xef:
          goto switchD_002d8c81_caseD_e8;
        case 0xed:
          pUVar9 = parseUdpDeclaration(this,attributes);
          return &pUVar9->super_MemberSyntax;
        case 0xf0:
          pPVar14 = parsePropertyDeclaration(this,attributes);
          return &pPVar14->super_MemberSyntax;
        }
      }
      else {
        if (uVar41 == 0xf9) {
          TVar44 = ParserBase::consume(&this->super_ParserBase);
          local_d0._8_4_ = SyntaxList;
          local_c0 = (SyntaxNode *)0x0;
          pSStack_b8 = (SyntaxNode *)0x0;
          local_d0._0_8_ = &PTR_getChild_006d0388;
          local_b0 = (Info *)_Var42._M_extent_value;
          local_a8 = attributes;
          data = parseDataDeclaration(this,(AttrList)ZEXT816(0));
          pCVar30 = slang::syntax::SyntaxFactory::checkerDataDeclaration
                              (&this->factory,
                               (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)local_d0,TVar44
                               ,data);
          return &pCVar30->super_MemberSyntax;
        }
        if (uVar41 == 0x105) {
          pCVar32 = parseConcurrentAssertion(this,(NamedLabelSyntax *)0x0,(AttrList)ZEXT816(0));
          goto LAB_002d9494;
        }
        if (uVar41 == 0x112) {
          pSVar11 = parseSequenceDeclaration(this,attributes);
          return &pSVar11->super_MemberSyntax;
        }
      }
    }
    else if (uVar41 < 0x12d) {
      if (uVar41 == 0x11a) {
        errorIfAttributes(this,attributes);
        pSVar31 = parseSpecifyBlock(this,attributes);
        return &pSVar31->super_MemberSyntax;
      }
      if (uVar41 == 0x11b) {
        pSVar34 = parseSpecparam(this,attributes,parentKind);
        return &pSVar34->super_MemberSyntax;
      }
      if (uVar41 == 0x129) {
        SVar2 = TaskDeclaration;
        TVar43 = EndTaskKeyword;
        goto LAB_002d9139;
      }
    }
    else {
      if (uVar41 - 0x12d < 2) {
        errorIfAttributes(this,attributes);
        pTVar13 = parseTimeUnitsDeclaration(this,attributes);
        return &pTVar13->super_MemberSyntax;
      }
      if (uVar41 == 0x145) {
        TVar44 = ParserBase::peek(&this->super_ParserBase,1);
        if (TVar44.kind == ClassKeyword) {
LAB_002d93bd:
          TVar44 = ParserBase::consume(&this->super_ParserBase);
          pCVar29 = parseClassDeclaration(this,attributes,TVar44);
          return &pCVar29->super_MemberSyntax;
        }
      }
      else if (uVar41 == 0x155) {
        TVar44 = ParserBase::peek(&this->super_ParserBase,1);
        if (((TVar44.kind == DoubleColon) &&
            (TVar44 = ParserBase::peek(&this->super_ParserBase,2), TVar44.kind == Identifier)) &&
           (TVar44 = ParserBase::peek(&this->super_ParserBase,3), TVar44.kind == Identifier)) {
          pCVar10 = parseCheckerInstantiation(this,attributes);
          return &pCVar10->super_MemberSyntax;
        }
        goto LAB_002d8b07;
      }
    }
    goto switchD_002d8b78_caseD_a6;
  }
  if (uVar41 < 0x5e) {
    if (uVar41 == 2) {
      TVar44 = ParserBase::peek(&this->super_ParserBase,1);
      if (TVar44.kind == Colon) {
        TVar44 = ParserBase::peek(&this->super_ParserBase,2);
        uVar41 = TVar44.kind - 100;
        if ((uVar41 < 0x1e) && ((0x20000005U >> (uVar41 & 0x1f) & 1) != 0)) {
          name = ParserBase::consume(&this->super_ParserBase);
          this_00 = &this->factory;
          colon = ParserBase::expect(&this->super_ParserBase,Colon);
          label = slang::syntax::SyntaxFactory::namedLabel(this_00,name,colon);
          pCVar32 = (ConcurrentAssertionStatementSyntax *)
                    parseAssertionStatement(this,label,(AttrList)ZEXT816(0));
          uVar41 = (pCVar32->super_StatementSyntax).super_SyntaxNode.kind - ImmediateAssertStatement
          ;
          if ((uVar41 < 4) && (uVar41 != 1)) {
            local_d0._8_4_ = SyntaxList;
            local_c0 = (SyntaxNode *)0x0;
            pSStack_b8 = (SyntaxNode *)0x0;
            local_d0._0_8_ = &PTR_getChild_006d0388;
            local_b0 = (Info *)_Var42._M_extent_value;
            local_a8 = attributes;
            anyLocalModules =
                 (bool *)slang::syntax::SyntaxFactory::immediateAssertionMember
                                   (this_00,(SyntaxList<slang::syntax::AttributeInstanceSyntax> *)
                                            local_d0,(ImmediateAssertionStatementSyntax *)pCVar32);
          }
          else {
            local_d0._8_4_ = SyntaxList;
            local_c0 = (SyntaxNode *)0x0;
            pSStack_b8 = (SyntaxNode *)0x0;
            local_d0._0_8_ = &PTR_getChild_006d0388;
            local_b0 = (Info *)_Var42._M_extent_value;
            local_a8 = attributes;
            anyLocalModules =
                 (bool *)slang::syntax::SyntaxFactory::concurrentAssertionMember
                                   (this_00,(SyntaxList<slang::syntax::AttributeInstanceSyntax> *)
                                            local_d0,pCVar32);
          }
        }
        uVar41 = (TVar44._0_4_ & 0xffff) - 100;
        if ((uVar41 < 0x1e) && ((0x20000005U >> (uVar41 & 0x1f) & 1) != 0)) {
          return &((ConcurrentAssertionMemberSyntax *)anyLocalModules)->super_MemberSyntax;
        }
      }
      TVar44 = ParserBase::peek(&this->super_ParserBase,1);
      if ((TVar44.kind == Hash) ||
         (TVar44 = ParserBase::peek(&this->super_ParserBase,1), TVar44.kind == OpenParenthesis)) {
        pPVar36 = parsePrimitiveInstantiation(this,attributes);
        return &pPVar36->super_MemberSyntax;
      }
      TVar44 = ParserBase::peek(&this->super_ParserBase,1);
      if (((TVar44.kind == DoubleColon) &&
          (TVar44 = ParserBase::peek(&this->super_ParserBase,2), TVar44.kind == Identifier)) &&
         (TVar44 = ParserBase::peek(&this->super_ParserBase,3), TVar44.kind == Identifier)) {
        pCVar10 = parseCheckerInstantiation(this,attributes);
        return &pCVar10->super_MemberSyntax;
      }
      pMVar6 = parseVariableDeclaration(this,attributes);
      return pMVar6;
    }
    if (uVar41 == 3) {
      pEVar35 = parseElabSystemTask(this,attributes);
LAB_002d9503:
      if (pEVar35 != (ElabSystemTaskSyntax *)0x0) {
        return &pEVar35->super_MemberSyntax;
      }
    }
    else if (uVar41 == 0x13) {
      local_d0._8_4_ = SyntaxList;
      local_c0 = (SyntaxNode *)0x0;
      pSStack_b8 = (SyntaxNode *)0x0;
      local_d0._0_8_ = &PTR_getChild_006d0388;
      local_78.super_SyntaxListBase.super_SyntaxNode.kind = 2;
      local_78.super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)0x0;
      local_78.super_SyntaxListBase.super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
      local_78.super_SyntaxListBase.childCount = 0;
      local_78.super_span<slang::parsing::Token,_18446744073709551615UL> =
           (span<slang::parsing::Token,_18446744073709551615UL>)ZEXT816(0);
      local_78.super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_006d0988;
      local_b0 = (Info *)_Var42._M_extent_value;
      local_a8 = attributes;
      TVar46 = ParserBase::consume(&this->super_ParserBase);
      goto LAB_002d9781;
    }
    goto switchD_002d8b78_caseD_a6;
  }
  switch(uVar41) {
  case 0x5e:
    pNVar26 = parseNetAlias(this,attributes);
    return &pNVar26->super_MemberSyntax;
  case 0x5f:
  case 0x60:
  case 0x61:
  case 0x62:
switchD_002d8b78_caseD_a8:
    TVar46 = ParserBase::consume(&this->super_ParserBase);
    SVar2 = slang::syntax::SyntaxFacts::getProceduralBlockKind(TVar46.kind);
    bVar1 = false;
LAB_002d8c2c:
    local_d0._8_4_ = SyntaxList;
    local_f8 = &this->factory;
    pSStack_b8 = (SyntaxNode *)0x0;
    local_c0 = (SyntaxNode *)0x0;
    local_d0._0_8_ = &PTR_getChild_006d0388;
    local_b0 = (Info *)_Var42._M_extent_value;
    local_a8 = attributes;
    statement = parseStatement(this,bVar1,false);
    pPVar8 = slang::syntax::SyntaxFactory::proceduralBlock
                       (local_f8,SVar2,
                        (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)local_d0,TVar46,
                        statement);
    return &pPVar8->super_MemberSyntax;
  case 100:
  case 0x66:
  case 0x81:
    pCVar32 = (ConcurrentAssertionStatementSyntax *)
              parseAssertionStatement(this,(NamedLabelSyntax *)0x0,(AttrList)ZEXT816(0));
    uVar41 = (pCVar32->super_StatementSyntax).super_SyntaxNode.kind - ImmediateAssertStatement;
    if ((uVar41 < 4) && (uVar41 != 1)) {
      local_d0._8_4_ = SyntaxList;
      local_c0 = (SyntaxNode *)0x0;
      pSStack_b8 = (SyntaxNode *)0x0;
      local_d0._0_8_ = &PTR_getChild_006d0388;
      local_b0 = (Info *)_Var42._M_extent_value;
      local_a8 = attributes;
      pIVar12 = slang::syntax::SyntaxFactory::immediateAssertionMember
                          (&this->factory,
                           (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)local_d0,
                           (ImmediateAssertionStatementSyntax *)pCVar32);
      return &pIVar12->super_MemberSyntax;
    }
LAB_002d9494:
    local_d0._8_4_ = SyntaxList;
    local_c0 = (SyntaxNode *)0x0;
    pSStack_b8 = (SyntaxNode *)0x0;
    local_d0._0_8_ = &PTR_getChild_006d0388;
    local_b0 = (Info *)_Var42._M_extent_value;
    local_a8 = attributes;
    pCVar33 = slang::syntax::SyntaxFactory::concurrentAssertionMember
                        (&this->factory,
                         (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)local_d0,pCVar32);
    return &pCVar33->super_MemberSyntax;
  case 0x65:
    pCVar24 = parseContinuousAssign(this,attributes);
    return &pCVar24->super_MemberSyntax;
  case 0x69:
    errorIfAttributes(this,attributes);
    if (_Var42._M_extent_value == 0) {
      SVar38 = Token::location(&local_f0);
      ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0xc70005,SVar38);
      pMVar6 = parseGenerateBlock(this);
      return pMVar6;
    }
    break;
  case 0x6a:
    pBVar21 = parseBindDirective(this,attributes);
    return &pBVar21->super_MemberSyntax;
  case 0x73:
    pCVar22 = parseCaseGenerateConstruct(this,attributes);
    return &pCVar22->super_MemberSyntax;
  case 0x78:
    pCVar23 = parseCheckerDeclaration(this,attributes);
    return &pCVar23->super_MemberSyntax;
  case 0x79:
    Token::Token(&local_40);
    pCVar29 = parseClassDeclaration(this,attributes,local_40);
    return &pCVar29->super_MemberSyntax;
  case 0x7a:
    goto switchD_002d8bd3_caseD_7a;
  case 0x7c:
    errorIfAttributes(this,attributes);
    pCVar20 = parseConfigDeclaration(this,attributes);
    return &pCVar20->super_MemberSyntax;
  case 0x7e:
    pMVar6 = parseConstraint(this,attributes,
                             (span<slang::parsing::Token,_18446744073709551615UL>)ZEXT816(0),true);
    return pMVar6;
  case 0x82:
    pCVar27 = parseCovergroupDeclaration(this,attributes,false,false);
    return &pCVar27->super_MemberSyntax;
  case 0x86:
switchD_002d8b78_caseD_b3:
    TVar44 = ParserBase::peek(&this->super_ParserBase,1);
    if (TVar44.kind == ClockingKeyword) {
switchD_002d8bd3_caseD_7a:
      pMVar6 = parseClockingDeclaration(this,attributes);
      return pMVar6;
    }
    TVar44 = ParserBase::peek(&this->super_ParserBase,1);
    if (TVar43 == DefaultKeyword && TVar44.kind == DisableKeyword) {
      pMVar6 = parseDefaultDisable(this,attributes);
      return pMVar6;
    }
  default:
switchD_002d8b78_caseD_a6:
    bVar1 = slang::syntax::SyntaxFacts::isGateType(TVar43);
    if (bVar1) {
      pPVar36 = parsePrimitiveInstantiation(this,attributes);
      return &pPVar36->super_MemberSyntax;
    }
    bVar1 = slang::syntax::SyntaxFacts::isMethodQualifier(TVar43);
    if (bVar1) {
      Token::Token((Token *)&local_78);
      offset = 0;
      do {
        offset = offset + 1;
        local_78.super_SyntaxListBase._0_16_ = ParserBase::peek(&this->super_ParserBase,offset);
        bVar1 = slang::syntax::SyntaxFacts::isMethodQualifier
                          ((TokenKind)local_78.super_SyntaxListBase._vptr_SyntaxListBase);
      } while (bVar1);
      if ((TokenKind)local_78.super_SyntaxListBase._vptr_SyntaxListBase == ConstraintKeyword) {
        local_d0._0_8_ = &pSStack_b8;
        local_d0._8_8_ = (Info *)0x0;
        local_c0 = (SyntaxNode *)0x4;
        src = extraout_RDX;
        if (offset != 0) {
          do {
            local_e0 = ParserBase::consume(&this->super_ParserBase);
            SmallVectorBase<slang::parsing::Token>::emplace_back<slang::parsing::Token_const&>
                      ((SmallVectorBase<slang::parsing::Token> *)local_d0,&local_e0);
            src = extraout_RDX_00;
            if ((local_e0.kind != StaticKeyword) &&
               (bVar1 = slang::syntax::SyntaxFacts::isConstraintQualifier(local_e0.kind),
               src = extraout_RDX_01, bVar1)) {
              SVar45 = Token::range(&local_e0);
              this_01 = ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0xf0005,SVar45);
              arg = Token::valueText(&local_e0);
              Diagnostic::operator<<(this_01,arg);
              src = extraout_RDX_02;
            }
            offset = offset - 1;
          } while (offset != 0);
        }
        iVar3 = SmallVectorBase<slang::parsing::Token>::copy
                          ((SmallVectorBase<slang::parsing::Token> *)local_d0,
                           (EVP_PKEY_CTX *)(this->super_ParserBase).alloc,src);
        qualifiers._M_ptr._4_4_ = extraout_var;
        qualifiers._M_ptr._0_4_ = iVar3;
        qualifiers._M_extent._M_extent_value = extraout_RDX_03._M_extent_value;
        pMVar6 = parseConstraint(this,attributes,qualifiers,true);
        if ((pointer)local_d0._0_8_ == (pointer)&pSStack_b8) {
          return pMVar6;
        }
        operator_delete((void *)local_d0._0_8_);
        return pMVar6;
      }
      if (((TokenKind)local_78.super_SyntaxListBase._vptr_SyntaxListBase == TaskKeyword) ||
         ((TokenKind)local_78.super_SyntaxListBase._vptr_SyntaxListBase == FunctionKeyword)) {
        SVar45 = Token::range(&local_f0);
        ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x9b0005,SVar45);
        for (; offset != 0; offset = offset - 1) {
          ParserBase::skipToken(&this->super_ParserBase,(optional<slang::DiagCode>)0x0);
        }
        SVar2 = TaskDeclaration;
        if ((TokenKind)local_78.super_SyntaxListBase._vptr_SyntaxListBase == FunctionKeyword) {
          SVar2 = FunctionDeclaration;
        }
        endKind = slang::syntax::SyntaxFacts::getSkipToKind
                            ((TokenKind)local_78.super_SyntaxListBase._vptr_SyntaxListBase);
        pFVar37 = parseFunctionDeclaration
                            (this,attributes,SVar2,endKind,parentKind,
                             (bitmask<slang::parsing::detail::FunctionOptions>)0x0);
        return &pFVar37->super_MemberSyntax;
      }
    }
    if (_Var42._M_extent_value == 0) {
      return (MemberSyntax *)0x0;
    }
    break;
  case 0x87:
    pDVar25 = parseDefParam(this,attributes);
    return &pDVar25->super_MemberSyntax;
  }
  local_d0._8_4_ = SyntaxList;
  local_c0 = (SyntaxNode *)0x0;
  pSStack_b8 = (SyntaxNode *)0x0;
  local_d0._0_8_ = &PTR_getChild_006d0388;
  local_78.super_SyntaxListBase.super_SyntaxNode.kind = 2;
  local_78.super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)0x0;
  local_78.super_SyntaxListBase.super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
  local_78.super_SyntaxListBase.childCount = 0;
  local_78.super_span<slang::parsing::Token,_18446744073709551615UL> =
       (span<slang::parsing::Token,_18446744073709551615UL>)ZEXT816(0);
  local_78.super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_006d0988;
  alloc = (this->super_ParserBase).alloc;
  local_b0 = (Info *)_Var42._M_extent_value;
  local_a8 = attributes;
  SVar38 = Token::location(&local_f0);
  TVar46 = Token::createMissing(alloc,Semicolon,SVar38);
LAB_002d9781:
  pEVar39 = slang::syntax::SyntaxFactory::emptyMember
                      (&this->factory,(SyntaxList<slang::syntax::AttributeInstanceSyntax> *)local_d0
                       ,&local_78,TVar46);
  return &pEVar39->super_MemberSyntax;
}

Assistant:

MemberSyntax* Parser::parseMember(SyntaxKind parentKind, bool& anyLocalModules) {
    auto attributes = parseAttributes();

    if (isHierarchyInstantiation(/* requireName */ false))
        return &parseHierarchyInstantiation(attributes);
    if (isPortDeclaration(/* inStatement */ false))
        return &parsePortDeclaration(attributes);
    if (isNetDeclaration())
        return &parseNetDeclaration(attributes);
    if (isVariableDeclaration())
        return &parseVariableDeclaration(attributes);

    Token token = peek();
    switch (token.kind) {
        case TokenKind::GenerateKeyword: {
            errorIfAttributes(attributes);
            auto keyword = consume();

            Token endgenerate;
            auto members = parseMemberList<MemberSyntax>(
                TokenKind::EndGenerateKeyword, endgenerate, SyntaxKind::GenerateRegion,
                [this](SyntaxKind parentKind, bool& anyLocalModules) {
                    return parseMember(parentKind, anyLocalModules);
                });
            return &factory.generateRegion(attributes, keyword, members, endgenerate);
        }
        case TokenKind::BeginKeyword:
            errorIfAttributes(attributes);
            if (!attributes.empty()) {
                return &factory.emptyMember(attributes, nullptr,
                                            Token::createMissing(alloc, TokenKind::Semicolon,
                                                                 token.location()));
            }

            // It's definitely not legal to have a generate block here on its own
            // (without an if or for loop) but some simulators seems to accept it
            // and I've found code in the wild that depends on it. We'll parse it
            // here and then issue a diagnostic about how it's not kosher.
            addDiag(diag::NonStandardGenBlock, token.location());
            return &parseGenerateBlock();
        case TokenKind::TimeUnitKeyword:
        case TokenKind::TimePrecisionKeyword:
            errorIfAttributes(attributes);
            return &parseTimeUnitsDeclaration(attributes);
        case TokenKind::ModuleKeyword:
        case TokenKind::MacromoduleKeyword:
        case TokenKind::ProgramKeyword:
        case TokenKind::PackageKeyword:
            // modules, interfaces, and programs share the same syntax
            return &parseModule(attributes, parentKind, anyLocalModules);
        case TokenKind::InterfaceKeyword:
            // an interface class is different from an interface
            if (peek(1).kind == TokenKind::ClassKeyword)
                return &parseClassDeclaration(attributes, consume());
            else
                return &parseModule(attributes, parentKind, anyLocalModules);
        case TokenKind::ModPortKeyword:
            return &parseModportDeclaration(attributes);
        case TokenKind::BindKeyword:
            return &parseBindDirective(attributes);
        case TokenKind::SpecParamKeyword:
            return &parseSpecparam(attributes, parentKind);
        case TokenKind::AliasKeyword:
            return &parseNetAlias(attributes);
        case TokenKind::SpecifyKeyword:
            errorIfAttributes(attributes);
            return &parseSpecifyBlock(attributes);
        case TokenKind::Identifier:
            if (peek(1).kind == TokenKind::Colon) {
                // Declarations and instantiations have already been handled, so if we reach this
                // point we either have a labeled assertion, or this is some kind of error.
                TokenKind next = peek(2).kind;
                if (next == TokenKind::AssertKeyword || next == TokenKind::AssumeKeyword ||
                    next == TokenKind::CoverKeyword) {

                    auto name = consume();
                    auto& label = factory.namedLabel(name, expect(TokenKind::Colon));
                    auto& statement = parseAssertionStatement(&label, {});
                    switch (statement.kind) {
                        case SyntaxKind::ImmediateAssertStatement:
                        case SyntaxKind::ImmediateAssumeStatement:
                        case SyntaxKind::ImmediateCoverStatement:
                            return &factory.immediateAssertionMember(
                                attributes, statement.as<ImmediateAssertionStatementSyntax>());
                        default:
                            return &factory.concurrentAssertionMember(
                                attributes, statement.as<ConcurrentAssertionStatementSyntax>());
                    }
                }
            }

            // If there's a hash or parenthesis here this is likely a primitive instantiation.
            if (peek(1).kind == TokenKind::Hash || peek(1).kind == TokenKind::OpenParenthesis) {
                return &parsePrimitiveInstantiation(attributes);
            }

            // A double colon could be a package-scoped checker instantiation.
            if (peek(1).kind == TokenKind::DoubleColon && peek(2).kind == TokenKind::Identifier &&
                peek(3).kind == TokenKind::Identifier) {
                return &parseCheckerInstantiation(attributes);
            }

            // Otherwise, assume it's an (erroneous) attempt at a variable declaration.
            return &parseVariableDeclaration(attributes);
        case TokenKind::UnitSystemName: {
            // The only valid thing this can be is a checker instantiation, since
            // variable declarations would have been handled previously. Because these
            // are rare, disambiguate for a bit and then fall back to parsing as a
            // variable decl anyway for a better error message.
            if (peek(1).kind == TokenKind::DoubleColon && peek(2).kind == TokenKind::Identifier &&
                peek(3).kind == TokenKind::Identifier) {
                return &parseCheckerInstantiation(attributes);
            }
            return &parseVariableDeclaration(attributes);
        }
        case TokenKind::AssertKeyword:
        case TokenKind::AssumeKeyword:
        case TokenKind::CoverKeyword: {
            auto& statement = parseAssertionStatement(nullptr, {});
            switch (statement.kind) {
                case SyntaxKind::ImmediateAssertStatement:
                case SyntaxKind::ImmediateAssumeStatement:
                case SyntaxKind::ImmediateCoverStatement:
                    return &factory.immediateAssertionMember(
                        attributes, statement.as<ImmediateAssertionStatementSyntax>());
                default:
                    return &factory.concurrentAssertionMember(
                        attributes, statement.as<ConcurrentAssertionStatementSyntax>());
            }
        }
        case TokenKind::RestrictKeyword: {
            auto& statement = parseConcurrentAssertion(nullptr, {});
            return &factory.concurrentAssertionMember(
                attributes, statement.as<ConcurrentAssertionStatementSyntax>());
        }
        case TokenKind::AssignKeyword:
            return &parseContinuousAssign(attributes);
        case TokenKind::InitialKeyword: {
            auto keyword = consume();
            return &factory.proceduralBlock(getProceduralBlockKind(keyword.kind), attributes,
                                            keyword, parseStatement());
        }
        case TokenKind::FinalKeyword:
        case TokenKind::AlwaysKeyword:
        case TokenKind::AlwaysCombKeyword:
        case TokenKind::AlwaysFFKeyword:
        case TokenKind::AlwaysLatchKeyword: {
            auto keyword = consume();
            return &factory.proceduralBlock(getProceduralBlockKind(keyword.kind), attributes,
                                            keyword, parseStatement(false));
        }
        case TokenKind::ForKeyword:
            return &parseLoopGenerateConstruct(attributes);
        case TokenKind::IfKeyword:
            return &parseIfGenerateConstruct(attributes);
        case TokenKind::CaseKeyword:
            return &parseCaseGenerateConstruct(attributes);
        case TokenKind::GenVarKeyword:
            return &parseGenvarDeclaration(attributes);
        case TokenKind::TaskKeyword:
            return &parseFunctionDeclaration(attributes, SyntaxKind::TaskDeclaration,
                                             TokenKind::EndTaskKeyword, parentKind);
        case TokenKind::FunctionKeyword:
            return &parseFunctionDeclaration(attributes, SyntaxKind::FunctionDeclaration,
                                             TokenKind::EndFunctionKeyword, parentKind);
        case TokenKind::CoverGroupKeyword:
            return &parseCovergroupDeclaration(attributes, /* inClass */ false,
                                               /* hasBaseClass */ false);
        case TokenKind::ClassKeyword:
            return &parseClassDeclaration(attributes, Token());
        case TokenKind::VirtualKeyword:
            if (peek(1).kind == TokenKind::ClassKeyword)
                return &parseClassDeclaration(attributes, consume());
            break;
        case TokenKind::DefParamKeyword:
            return &parseDefParam(attributes);
        case TokenKind::ImportKeyword:
            if (peek(1).kind == TokenKind::StringLiteral) {
                return &parseDPIImport(attributes);
            }
            return &parseImportDeclaration(attributes);
        case TokenKind::ExportKeyword:
            if (peek(1).kind == TokenKind::StringLiteral) {
                return &parseDPIExport(attributes);
            }
            return &parseExportDeclaration(attributes);
        case TokenKind::Semicolon:
            return &factory.emptyMember(attributes, nullptr, consume());
        case TokenKind::PropertyKeyword:
            return &parsePropertyDeclaration(attributes);
        case TokenKind::SequenceKeyword:
            return &parseSequenceDeclaration(attributes);
        case TokenKind::CheckerKeyword:
            return &parseCheckerDeclaration(attributes);
        case TokenKind::GlobalKeyword:
        case TokenKind::DefaultKeyword:
            if (peek(1).kind == TokenKind::ClockingKeyword) {
                return &parseClockingDeclaration(attributes);
            }
            else if (peek(1).kind == TokenKind::DisableKeyword &&
                     token.kind == TokenKind::DefaultKeyword) {
                return &parseDefaultDisable(attributes);
            }
            break;
        case TokenKind::ClockingKeyword:
            return &parseClockingDeclaration(attributes);
        case TokenKind::SystemIdentifier: {
            auto result = parseElabSystemTask(attributes);
            if (result)
                return result;
            break;
        }
        case TokenKind::ConstraintKeyword:
            return &parseConstraint(attributes, {}, true);
        case TokenKind::PrimitiveKeyword:
            return &parseUdpDeclaration(attributes);
        case TokenKind::RandKeyword: {
            auto rand = consume();
            return &factory.checkerDataDeclaration(attributes, rand, parseDataDeclaration({}));
        }
        case TokenKind::ExternKeyword:
            errorIfAttributes(attributes);
            if (auto member = parseExternMember(parentKind, attributes))
                return member;
            break;
        case TokenKind::ConfigKeyword:
            errorIfAttributes(attributes);
            return &parseConfigDeclaration(attributes);
        default:
            break;
    }

    if (isGateType(token.kind))
        return &parsePrimitiveInstantiation(attributes);

    // If this is a class qualifier, maybe they accidentally put them
    // on an out-of-block method definition.
    if (isMethodQualifier(token.kind)) {
        Token t;
        uint32_t index = 0;
        do {
            t = peek(++index);
        } while (isMethodQualifier(t.kind));

        if (t.kind == TokenKind::FunctionKeyword || t.kind == TokenKind::TaskKeyword) {
            // Skip all the qualifiers.
            addDiag(diag::QualifiersOnOutOfBlock, token.range());
            for (uint32_t i = 0; i < index; i++)
                skipToken(std::nullopt);

            auto kind = t.kind == TokenKind::FunctionKeyword ? SyntaxKind::FunctionDeclaration
                                                             : SyntaxKind::TaskDeclaration;
            return &parseFunctionDeclaration(attributes, kind, getSkipToKind(t.kind), parentKind);
        }

        if (t.kind == TokenKind::ConstraintKeyword) {
            // Out-of-block constraints can legitimately have the 'static' keyword,
            // but nothing else.
            SmallVector<Token, 4> quals;
            for (uint32_t i = 0; i < index; i++) {
                Token qual = consume();
                quals.push_back(qual);

                if (qual.kind != TokenKind::StaticKeyword && isConstraintQualifier(qual.kind))
                    addDiag(diag::ConstraintQualOutOfBlock, qual.range()) << qual.valueText();
            }

            return &parseConstraint(attributes, quals.copy(alloc), true);
        }
    }

    // if we got attributes but don't know what comes next, we have some kind of nonsense
    if (!attributes.empty()) {
        return &factory.emptyMember(attributes, nullptr,
                                    Token::createMissing(alloc, TokenKind::Semicolon,
                                                         token.location()));
    }

    // Otherwise, we got nothing and should just return null so that our
    // caller will skip and try again.
    return nullptr;
}